

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::float_writer<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          float_writer<wchar_t> *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte bVar7;
  wchar_t *pwVar8;
  ulong uVar9;
  long lVar10;
  size_t size;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  buffer<wchar_t> *c;
  int iVar19;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  uVar13 = (ulong)(uint)specs->width;
  uVar9 = f->size_;
  puVar2 = *(undefined8 **)this;
  lVar10 = puVar2[2];
  uVar11 = uVar13 - uVar9;
  if (uVar13 < uVar9 || uVar11 == 0) {
    uVar9 = uVar9 + lVar10;
    if ((ulong)puVar2[3] < uVar9) {
      (**(code **)*puVar2)(puVar2,uVar9);
    }
    puVar2[2] = uVar9;
    pwVar8 = (wchar_t *)(lVar10 * 4 + puVar2[1]);
    bVar7 = (f->specs_).field_0x5;
LAB_0016f047:
    if (bVar7 != 0) {
      *pwVar8 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)(uint)bVar7);
      pwVar8 = pwVar8 + 1;
    }
    float_writer<wchar_t>::prettify<wchar_t*>(f,pwVar8);
    return;
  }
  uVar12 = lVar10 + uVar13;
  if ((ulong)puVar2[3] < uVar12) {
    (**(code **)*puVar2)(puVar2,uVar12);
  }
  puVar2[2] = uVar12;
  auVar6 = _DAT_001aa3f0;
  auVar5 = _DAT_001aa3e0;
  auVar4 = _DAT_001a6090;
  lVar3 = puVar2[1];
  pwVar8 = (wchar_t *)(lVar3 + lVar10 * 4);
  wVar1 = (specs->fill).data_[0];
  bVar7 = specs->field_0x9 & 0xf;
  if (bVar7 == 3) {
    uVar12 = uVar11 >> 1;
    if (1 < uVar11) {
      pwVar8 = pwVar8 + uVar12;
      uVar11 = uVar12 + 0x3fffffffffffffff & 0x3fffffffffffffff;
      auVar24._8_4_ = (int)uVar11;
      auVar24._0_8_ = uVar11;
      auVar24._12_4_ = (int)(uVar11 >> 0x20);
      lVar3 = lVar3 + lVar10 * 4;
      lVar10 = 0;
      auVar24 = auVar24 ^ _DAT_001a6090;
      do {
        auVar21._8_4_ = (int)lVar10;
        auVar21._0_8_ = lVar10;
        auVar21._12_4_ = (int)((ulong)lVar10 >> 0x20);
        auVar25 = (auVar21 | auVar6) ^ auVar4;
        iVar19 = auVar24._4_4_;
        if ((bool)(~(auVar25._4_4_ == iVar19 && auVar24._0_4_ < auVar25._0_4_ ||
                    iVar19 < auVar25._4_4_) & 1)) {
          *(wchar_t *)(lVar3 + lVar10 * 4) = wVar1;
        }
        if ((auVar25._12_4_ != auVar24._12_4_ || auVar25._8_4_ <= auVar24._8_4_) &&
            auVar25._12_4_ <= auVar24._12_4_) {
          *(wchar_t *)(lVar3 + 4 + lVar10 * 4) = wVar1;
        }
        auVar21 = (auVar21 | auVar5) ^ auVar4;
        iVar26 = auVar21._4_4_;
        if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar21._0_4_ <= auVar24._0_4_)) {
          *(wchar_t *)(lVar3 + 8 + lVar10 * 4) = wVar1;
          *(wchar_t *)(lVar3 + 0xc + lVar10 * 4) = wVar1;
        }
        lVar10 = lVar10 + 4;
      } while ((uVar11 - ((uint)(uVar12 + 0x3fffffffffffffff) & 3)) + 4 != lVar10);
    }
    uVar11 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar11 != 0) {
      *pwVar8 = (int)*(char *)((long)&basic_data<void>::signs + uVar11);
      pwVar8 = pwVar8 + 1;
    }
    pwVar8 = float_writer<wchar_t>::prettify<wchar_t*>(f,pwVar8);
    auVar6 = _DAT_001aa3f0;
    auVar5 = _DAT_001aa3e0;
    auVar4 = _DAT_001a6090;
    uVar11 = (uVar13 * 4 + (uVar9 + uVar12) * -4) - 4;
    auVar25._8_4_ = (int)uVar11;
    auVar25._0_8_ = uVar11;
    auVar25._12_4_ = (int)(uVar11 >> 0x20);
    auVar16._0_8_ = uVar11 >> 2;
    auVar16._8_8_ = auVar25._8_8_ >> 2;
    uVar9 = 0;
    auVar16 = auVar16 ^ _DAT_001a6090;
    do {
      auVar22._8_4_ = (int)uVar9;
      auVar22._0_8_ = uVar9;
      auVar22._12_4_ = (int)(uVar9 >> 0x20);
      auVar24 = (auVar22 | auVar6) ^ auVar4;
      iVar19 = auVar16._4_4_;
      if ((bool)(~(auVar24._4_4_ == iVar19 && auVar16._0_4_ < auVar24._0_4_ ||
                  iVar19 < auVar24._4_4_) & 1)) {
        pwVar8[uVar9] = wVar1;
      }
      if ((auVar24._12_4_ != auVar16._12_4_ || auVar24._8_4_ <= auVar16._8_4_) &&
          auVar24._12_4_ <= auVar16._12_4_) {
        pwVar8[uVar9 + 1] = wVar1;
      }
      auVar24 = (auVar22 | auVar5) ^ auVar4;
      iVar26 = auVar24._4_4_;
      if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar16._0_4_)) {
        pwVar8[uVar9 + 2] = wVar1;
        pwVar8[uVar9 + 3] = wVar1;
      }
      uVar9 = uVar9 + 4;
    } while (((uVar11 >> 2) + 4 & 0x7ffffffffffffffc) != uVar9);
  }
  else {
    if (bVar7 == 2) {
      pwVar8 = pwVar8 + uVar11;
      uVar11 = (uVar13 * 4 + uVar9 * -4) - 4;
      auVar14._8_4_ = (int)uVar11;
      auVar14._0_8_ = uVar11;
      auVar14._12_4_ = (int)(uVar11 >> 0x20);
      auVar15._0_8_ = uVar11 >> 2;
      auVar15._8_8_ = auVar14._8_8_ >> 2;
      lVar3 = lVar3 + lVar10 * 4;
      uVar9 = 0;
      auVar15 = auVar15 ^ _DAT_001a6090;
      do {
        auVar20._8_4_ = (int)uVar9;
        auVar20._0_8_ = uVar9;
        auVar20._12_4_ = (int)(uVar9 >> 0x20);
        auVar24 = (auVar20 | auVar6) ^ auVar4;
        iVar19 = auVar15._4_4_;
        if ((bool)(~(auVar24._4_4_ == iVar19 && auVar15._0_4_ < auVar24._0_4_ ||
                    iVar19 < auVar24._4_4_) & 1)) {
          *(wchar_t *)(lVar3 + uVar9 * 4) = wVar1;
        }
        if ((auVar24._12_4_ != auVar15._12_4_ || auVar24._8_4_ <= auVar15._8_4_) &&
            auVar24._12_4_ <= auVar15._12_4_) {
          *(wchar_t *)(lVar3 + 4 + uVar9 * 4) = wVar1;
        }
        auVar24 = (auVar20 | auVar5) ^ auVar4;
        iVar26 = auVar24._4_4_;
        if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar15._0_4_)) {
          *(wchar_t *)(lVar3 + 8 + uVar9 * 4) = wVar1;
          *(wchar_t *)(lVar3 + 0xc + uVar9 * 4) = wVar1;
        }
        uVar9 = uVar9 + 4;
      } while (((uVar11 >> 2) + 4 & 0x7ffffffffffffffc) != uVar9);
      bVar7 = (f->specs_).field_0x5;
      goto LAB_0016f047;
    }
    uVar11 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar11 != 0) {
      *pwVar8 = (int)*(char *)((long)&basic_data<void>::signs + uVar11);
      pwVar8 = pwVar8 + 1;
    }
    pwVar8 = float_writer<wchar_t>::prettify<wchar_t*>(f,pwVar8);
    auVar6 = _DAT_001aa3f0;
    auVar5 = _DAT_001aa3e0;
    auVar4 = _DAT_001a6090;
    uVar11 = (uVar13 * 4 + uVar9 * -4) - 4;
    auVar17._8_4_ = (int)uVar11;
    auVar17._0_8_ = uVar11;
    auVar17._12_4_ = (int)(uVar11 >> 0x20);
    auVar18._0_8_ = uVar11 >> 2;
    auVar18._8_8_ = auVar17._8_8_ >> 2;
    uVar9 = 0;
    auVar18 = auVar18 ^ _DAT_001a6090;
    do {
      auVar23._8_4_ = (int)uVar9;
      auVar23._0_8_ = uVar9;
      auVar23._12_4_ = (int)(uVar9 >> 0x20);
      auVar24 = (auVar23 | auVar6) ^ auVar4;
      iVar19 = auVar18._4_4_;
      if ((bool)(~(auVar24._4_4_ == iVar19 && auVar18._0_4_ < auVar24._0_4_ ||
                  iVar19 < auVar24._4_4_) & 1)) {
        pwVar8[uVar9] = wVar1;
      }
      if ((auVar24._12_4_ != auVar18._12_4_ || auVar24._8_4_ <= auVar18._8_4_) &&
          auVar24._12_4_ <= auVar18._12_4_) {
        pwVar8[uVar9 + 1] = wVar1;
      }
      auVar24 = (auVar23 | auVar5) ^ auVar4;
      iVar26 = auVar24._4_4_;
      if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar18._0_4_)) {
        pwVar8[uVar9 + 2] = wVar1;
        pwVar8[uVar9 + 3] = wVar1;
      }
      uVar9 = uVar9 + 4;
    } while (((uVar11 >> 2) + 4 & 0x7ffffffffffffffc) != uVar9);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }